

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.h
# Opt level: O0

void __thiscall duckdb_skiplistlib::skip_list::Exception::Exception(Exception *this,string *in_msg)

{
  string *in_RSI;
  exception *in_RDI;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__Exception_010a7530;
  std::__cxx11::string::string((string *)(in_RDI + 8),in_RSI);
  return;
}

Assistant:

explicit Exception(const std::string &in_msg) : msg(in_msg) {}